

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void GameLoop::initInstance
               (Map *map,vector<Player_*,_std::allocator<Player_*>_> *playerList,Deck *deck)

{
  ostream *poVar1;
  
  if (gameLoopInstance != (GameLoop *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Tried to create an instance of GameLoop, but one already exists!");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  gameLoopInstance = (GameLoop *)operator_new(0x18);
  gameLoopInstance->gameMap = map;
  gameLoopInstance->allPlayers = playerList;
  gameLoopInstance->gameDeck = deck;
  return;
}

Assistant:

void GameLoop::initInstance(Map* map, vector<Player*>* playerList, Deck* deck) {
    if (GameLoop::gameLoopInstance == nullptr) {
        GameLoop::gameLoopInstance = new GameLoop(map, playerList, deck);
    } else {
        std::cout << "Tried to create an instance of GameLoop, but one already exists!" << std::endl;
    }
}